

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptScopedCompoundStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  bool result;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  HlslParseContext::pushScope(this->parseContext);
  bVar1 = acceptCompoundStatement(this,statement);
  HlslParseContext::popScope(this->parseContext);
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptScopedCompoundStatement(TIntermNode*& statement)
{
    parseContext.pushScope();
    bool result = acceptCompoundStatement(statement);
    parseContext.popScope();

    return result;
}